

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O3

QPoint QtGuiTest::toNativePixels(QPoint *value,QWindow *window)

{
  QDebug this;
  QPoint QVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QDebug local_68;
  QPoint local_60;
  QWindow local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    this.stream = local_68.stream;
    QVar2.m_data = (storage_type *)0x1b;
    QVar2.m_size = (qsizetype)&local_58.super_QSurface;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<(&(this.stream)->ts,(QString *)&local_58.super_QSurface);
    if ((QArrayData *)local_58.super_QSurface._vptr_QSurface != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58.super_QSurface._vptr_QSurface)->_q_value).
      super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58.super_QSurface._vptr_QSurface)->_q_value).
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58.super_QSurface._vptr_QSurface)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.super_QSurface._vptr_QSurface,2,0x10);
      }
    }
    if ((local_68.stream)->space == true) {
      QTextStream::operator<<(&(local_68.stream)->ts,' ');
    }
    (local_68.stream)->ref = (local_68.stream)->ref + 1;
    ::operator<<((QDebug *)&local_58,&local_60);
    ::operator<<((QDebug)&local_58.field_0x8,&local_58);
    QDebug::~QDebug((QDebug *)&local_58.field_0x8);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug(&local_68);
  }
  QVar1 = QHighDpi::toNativePixels<QPoint,QWindow>(value,window);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QtGuiTest::toNativePixels(const QPoint &value, const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating native pixels: " << value << window;
    return QHighDpi::toNativePixels<QPoint, QWindow>(value, window);
}